

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O2

void __thiscall WangLandauSampler::sample(WangLandauSampler *this,uint total_steps,uint round_trips)

{
  Histogram<unsigned_int> *pHVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  allocator<char> local_75;
  uint local_74;
  string local_70;
  string local_50 [32];
  
  uVar4 = 0;
  local_74 = round_trips;
  while (uVar4 != total_steps) {
    poVar2 = std::operator<<((ostream *)&std::cout,"w-l step: ");
    uVar4 = uVar4 + 1;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    (*((this->super_UniformSampler).super_Sampler.histogram)->_vptr_Histogram[2])();
    uVar3 = local_74;
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      perform_round_trip(this);
    }
    this->f = this->f * 0.5;
    pHVar1 = (this->super_UniformSampler).super_Sampler.histogram;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"tmp.dat",&local_75);
    (*pHVar1->_vptr_Histogram[4])(pHVar1,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"entropy_tmp.dat",&local_75);
    export_entropy(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void sample(unsigned int total_steps, unsigned int round_trips=5) {
        for (unsigned int step = 0; step < total_steps; step++) {
            std::cout << "w-l step: " << step + 1 << "/" << total_steps << std::endl;
            histogram.reset();
            for (unsigned int round_trip = 0; round_trip < round_trips; round_trip++)
                perform_round_trip();
            wang_landau_step();

            histogram.export_histogram("tmp.dat");
            export_entropy("entropy_tmp.dat");
            }
    }